

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O1

int hex_decode(JSContext *ctx,JSString *p,int k)

{
  uint uVar1;
  int iVar2;
  ushort uVar3;
  uint uVar4;
  char *fmt;
  
  uVar4 = (uint)*(undefined8 *)&p->field_0x4;
  uVar1 = uVar4 & 0x7fffffff;
  fmt = "expecting %%";
  if (k < (int)uVar1) {
    if ((int)uVar4 < 0) {
      uVar3 = *(ushort *)((long)&p[1].header.ref_count + (long)k * 2);
    }
    else {
      uVar3 = (ushort)*(byte *)((long)&p[1].header.ref_count + (long)k);
    }
    if (((uVar3 == 0x25) && (fmt = "expecting hex digit", k + 2 < (int)uVar1)) &&
       (iVar2 = string_get_hex(p,k + 1,2), -1 < iVar2)) {
      return iVar2;
    }
  }
  js_throw_URIError(ctx,fmt);
  return -1;
}

Assistant:

static int hex_decode(JSContext *ctx, JSString *p, int k) {
    int c;

    if (k >= p->len || string_get(p, k) != '%')
        return js_throw_URIError(ctx, "expecting %%");
    if (k + 2 >= p->len || (c = string_get_hex(p, k + 1, 2)) < 0)
        return js_throw_URIError(ctx, "expecting hex digit");

    return c;
}